

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O2

void ur_kinematics::forward_all
               (double *q,double *T1,double *T2,double *T3,double *T4,double *T5,double *T6)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar1 = sin(*q);
  dVar2 = cos(*q);
  dVar5 = q[1];
  dVar3 = sin(dVar5);
  dVar4 = cos(q[1]);
  sin(q[2]);
  cos(q[2]);
  dVar5 = dVar5 + q[2];
  dVar14 = q[3];
  dVar6 = sin(q[4]);
  dVar7 = cos(q[4]);
  dVar8 = sin(q[5]);
  dVar9 = cos(q[5]);
  dVar10 = sin(dVar5);
  dVar11 = cos(dVar5);
  dVar12 = sin(dVar14 + dVar5);
  dVar5 = cos(dVar14 + dVar5);
  if (T1 != (double *)0x0) {
    *T1 = dVar2;
    T1[1] = 0.0;
    T1[2] = dVar1;
    T1[3] = 0.0;
    T1[4] = dVar1;
    T1[5] = 0.0;
    T1[6] = -dVar2;
    T1[7] = 0.0;
    T1[8] = 0.0;
    T1[9] = 1.0;
    T1[10] = 0.0;
    T1[0xb] = 0.15185;
    T1[0xc] = 0.0;
    T1[0xd] = 0.0;
    T1[0xe] = 0.0;
    T1[0xf] = 1.0;
  }
  if (T2 != (double *)0x0) {
    *T2 = dVar4 * dVar2;
    T2[1] = -dVar2 * dVar3;
    T2[2] = dVar1;
    T2[3] = dVar4 * dVar2 * -0.24355;
    T2[4] = dVar4 * dVar1;
    T2[5] = -dVar1 * dVar3;
    T2[6] = -dVar2;
    T2[7] = dVar4 * -0.24355 * dVar1;
    T2[8] = dVar3;
    T2[9] = dVar4;
    T2[10] = 0.0;
    T2[0xb] = dVar3 * -0.24355 + 0.15185;
    T2[0xc] = 0.0;
    T2[0xd] = 0.0;
    T2[0xe] = 0.0;
    T2[0xf] = 1.0;
  }
  if (T3 != (double *)0x0) {
    *T3 = dVar11 * dVar2;
    T3[1] = -dVar10 * dVar2;
    T3[2] = dVar1;
    dVar14 = dVar11 * -0.2132 + dVar4 * -0.24355;
    T3[3] = dVar14 * dVar2;
    T3[4] = dVar11 * dVar1;
    T3[5] = -dVar10 * dVar1;
    T3[6] = -dVar2;
    T3[7] = dVar1 * dVar14;
    T3[8] = dVar10;
    T3[9] = dVar11;
    T3[10] = 0.0;
    T3[0xb] = dVar3 * -0.24355 + dVar10 * -0.2132 + 0.15185;
    T3[0xc] = 0.0;
    T3[0xd] = 0.0;
    T3[0xe] = 0.0;
    T3[0xf] = 1.0;
  }
  if (T4 != (double *)0x0) {
    *T4 = dVar2 * dVar5;
    T4[1] = dVar1;
    T4[2] = dVar2 * dVar12;
    dVar14 = dVar11 * -0.2132 + dVar4 * -0.24355;
    T4[3] = dVar2 * dVar14 + dVar1 * 0.13105;
    T4[4] = dVar1 * dVar5;
    T4[5] = -dVar2;
    T4[6] = dVar1 * dVar12;
    T4[7] = dVar14 * dVar1 + dVar2 * -0.13105;
    T4[8] = dVar12;
    T4[9] = 0.0;
    T4[10] = -dVar5;
    T4[0xb] = dVar3 * -0.24355 + dVar10 * -0.2132 + 0.15185;
    T4[0xc] = 0.0;
    T4[0xd] = 0.0;
    T4[0xe] = 0.0;
    T4[0xf] = 1.0;
  }
  if (T5 != (double *)0x0) {
    *T5 = dVar1 * dVar6 + dVar7 * dVar2 * dVar5;
    dVar14 = -dVar12;
    T5[1] = dVar2 * dVar14;
    dVar13 = dVar11 * -0.2132 + dVar4 * -0.24355;
    T5[2] = dVar1 * dVar7 + -(dVar2 * dVar5) * dVar6;
    T5[3] = dVar2 * dVar12 * 0.08535 + dVar2 * dVar13 + dVar1 * 0.13105;
    T5[4] = dVar7 * dVar5 * dVar1 - dVar6 * dVar2;
    T5[5] = dVar1 * dVar14;
    T5[6] = dVar7 * -dVar2 + -dVar5 * dVar1 * dVar6;
    T5[7] = dVar1 * dVar12 * 0.08535 + dVar13 * dVar1 + dVar2 * -0.13105;
    T5[8] = dVar7 * dVar12;
    T5[9] = dVar5;
    T5[10] = dVar14 * dVar6;
    T5[0xb] = dVar5 * -0.08535 + dVar3 * -0.24355 + dVar10 * -0.2132 + 0.15185;
    T5[0xc] = 0.0;
    T5[0xd] = 0.0;
    T5[0xe] = 0.0;
    T5[0xf] = 1.0;
  }
  if (T6 != (double *)0x0) {
    dVar13 = dVar1 * dVar6 + dVar7 * dVar2 * dVar5;
    dVar14 = -dVar12;
    *T6 = dVar13 * dVar9 + dVar2 * dVar14 * dVar8;
    T6[1] = dVar13 * -dVar8 + dVar2 * dVar14 * dVar9;
    dVar13 = dVar7 * dVar1 - dVar2 * dVar5 * dVar6;
    dVar15 = dVar11 * -0.2132 + dVar4 * -0.24355;
    T6[2] = dVar13;
    dVar4 = dVar2 * dVar6 - dVar7 * dVar5 * dVar1;
    T6[3] = dVar2 * dVar12 * 0.08535 + dVar1 * 0.13105 + dVar13 * 0.0921 + dVar2 * dVar15;
    T6[4] = dVar4 * -dVar9 + dVar1 * dVar14 * dVar8;
    dVar11 = dVar1 * dVar5 * dVar6;
    T6[5] = dVar4 * dVar8 + dVar9 * dVar14 * dVar1;
    T6[6] = dVar7 * -dVar2 + -dVar11;
    T6[7] = dVar1 * dVar12 * 0.08535 +
            (dVar2 * dVar7 + dVar11) * -0.0921 + dVar15 * dVar1 + dVar2 * -0.13105;
    T6[8] = dVar8 * dVar5 + dVar9 * dVar7 * dVar12;
    T6[9] = dVar5 * dVar9 - dVar7 * dVar12 * dVar8;
    T6[10] = dVar14 * dVar6;
    T6[0xb] = dVar12 * -0.0921 * dVar6 +
              dVar5 * -0.08535 + dVar3 * -0.24355 + dVar10 * -0.2132 + 0.15185;
    T6[0xc] = 0.0;
    T6[0xd] = 0.0;
    T6[0xe] = 0.0;
    T6[0xf] = 1.0;
  }
  return;
}

Assistant:

void forward_all(const double* q, double* T1, double* T2, double* T3,
                                    double* T4, double* T5, double* T6) {
    double s1 = sin(*q), c1 = cos(*q); q++; // q1
    double q23 = *q, q234 = *q, s2 = sin(*q), c2 = cos(*q); q++; // q2
    double s3 = sin(*q), c3 = cos(*q); q23 += *q; q234 += *q; q++; // q3
    q234 += *q; q++; // q4
    double s5 = sin(*q), c5 = cos(*q); q++; // q5
    double s6 = sin(*q), c6 = cos(*q); // q6
    double s23 = sin(q23), c23 = cos(q23);
    double s234 = sin(q234), c234 = cos(q234);

    if(T1 != NULL) {
      *T1 = c1; T1++;
      *T1 = 0; T1++;
      *T1 = s1; T1++;
      *T1 = 0; T1++;
      *T1 = s1; T1++;
      *T1 = 0; T1++;
      *T1 = -c1; T1++;
      *T1 = 0; T1++;
      *T1 =       0; T1++;
      *T1 = 1; T1++;
      *T1 = 0; T1++;
      *T1 =d1; T1++;
      *T1 =       0; T1++;
      *T1 = 0; T1++;
      *T1 = 0; T1++;
      *T1 = 1; T1++;
    }

    if(T2 != NULL) {
      *T2 = c1*c2; T2++;
      *T2 = -c1*s2; T2++;
      *T2 = s1; T2++;
      *T2 =a2*c1*c2; T2++;
      *T2 = c2*s1; T2++;
      *T2 = -s1*s2; T2++;
      *T2 = -c1; T2++;
      *T2 =a2*c2*s1; T2++;
      *T2 =         s2; T2++;
      *T2 = c2; T2++;
      *T2 = 0; T2++;
      *T2 =   d1 + a2*s2; T2++;
      *T2 =               0; T2++;
      *T2 = 0; T2++;
      *T2 = 0; T2++;
      *T2 =                 1; T2++;
    }

    if(T3 != NULL) {
      *T3 = c23*c1; T3++;
      *T3 = -s23*c1; T3++;
      *T3 = s1; T3++;
      *T3 =c1*(a3*c23 + a2*c2); T3++;
      *T3 = c23*s1; T3++;
      *T3 = -s23*s1; T3++;
      *T3 = -c1; T3++;
      *T3 =s1*(a3*c23 + a2*c2); T3++;
      *T3 =         s23; T3++;
      *T3 = c23; T3++;
      *T3 = 0; T3++;
      *T3 =     d1 + a3*s23 + a2*s2; T3++;
      *T3 =                    0; T3++;
      *T3 = 0; T3++;
      *T3 = 0; T3++;
      *T3 =                                     1; T3++;
    }

    if(T4 != NULL) {
      *T4 = c234*c1; T4++;
      *T4 = s1; T4++;
      *T4 = s234*c1; T4++;
      *T4 =c1*(a3*c23 + a2*c2) + d4*s1; T4++;
      *T4 = c234*s1; T4++;
      *T4 = -c1; T4++;
      *T4 = s234*s1; T4++;
      *T4 =s1*(a3*c23 + a2*c2) - d4*c1; T4++;
      *T4 =         s234; T4++;
      *T4 = 0; T4++;
      *T4 = -c234; T4++;
      *T4 =                  d1 + a3*s23 + a2*s2; T4++;
      *T4 =                         0; T4++;
      *T4 = 0; T4++;
      *T4 = 0; T4++;
      *T4 =                                                  1; T4++;
    }

    if(T5 != NULL) {
      *T5 = s1*s5 + c234*c1*c5; T5++;
      *T5 = -s234*c1; T5++;
      *T5 = c5*s1 - c234*c1*s5; T5++;
      *T5 =c1*(a3*c23 + a2*c2) + d4*s1 + d5*s234*c1; T5++;
      *T5 = c234*c5*s1 - c1*s5; T5++;
      *T5 = -s234*s1; T5++;
      *T5 = - c1*c5 - c234*s1*s5; T5++;
      *T5 =s1*(a3*c23 + a2*c2) - d4*c1 + d5*s234*s1; T5++;
      *T5 =                           s234*c5; T5++;
      *T5 = c234; T5++;
      *T5 = -s234*s5; T5++;
      *T5 =                          d1 + a3*s23 + a2*s2 - d5*c234; T5++;
      *T5 =                                                   0; T5++;
      *T5 = 0; T5++;
      *T5 = 0; T5++;
      *T5 =                                                                                 1; T5++;
    }

    if(T6 != NULL) {
      *T6 =   c6*(s1*s5 + c234*c1*c5) - s234*c1*s6; T6++;
      *T6 = - s6*(s1*s5 + c234*c1*c5) - s234*c1*c6; T6++;
      *T6 = c5*s1 - c234*c1*s5; T6++;
      *T6 =d6*(c5*s1 - c234*c1*s5) + c1*(a3*c23 + a2*c2) + d4*s1 + d5*s234*c1; T6++;
      *T6 = - c6*(c1*s5 - c234*c5*s1) - s234*s1*s6; T6++;
      *T6 = s6*(c1*s5 - c234*c5*s1) - s234*c6*s1; T6++;
      *T6 = - c1*c5 - c234*s1*s5; T6++;
      *T6 =s1*(a3*c23 + a2*c2) - d4*c1 - d6*(c1*c5 + c234*s1*s5) + d5*s234*s1; T6++;
      *T6 =                                       c234*s6 + s234*c5*c6; T6++;
      *T6 = c234*c6 - s234*c5*s6; T6++;
      *T6 = -s234*s5; T6++;
      *T6 =                                                      d1 + a3*s23 + a2*s2 - d5*c234 - d6*s234*s5; T6++;
      *T6 =                                                                                                   0; T6++;
      *T6 = 0; T6++;
      *T6 = 0; T6++;
      *T6 =                                                                                                                                            1; T6++;
    }
  }